

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::json_internal::Proto3Type::EnumNameByNumber_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Proto3Type *this,Field f,int32_t number)

{
  bool bVar1;
  int32_t iVar2;
  Status *x;
  Enum **ppEVar3;
  Enum *this_00;
  RepeatedPtrField<google::protobuf::EnumValue> *this_01;
  string *u;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> local_b0;
  string local_a0;
  undefined1 local_80 [16];
  Status local_70;
  EnumValue *local_68;
  EnumValue *ev;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::EnumValue> *__range3;
  Status local_38;
  Status _status;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  int32_t number_local;
  Field f_local;
  
  e.super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>.field_1._4_4_ =
       SUB84(f,0);
  ResolverPool::Field::EnumType((Field *)&_status);
  x = absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*>::
      status((StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)&_status);
  absl::lts_20240722::Status::Status(&local_38,x);
  bVar1 = absl::lts_20240722::Status::ok(&local_38);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20240722::
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr<const_absl::lts_20240722::Status,_0>(__return_storage_ptr__,&local_38);
  }
  absl::lts_20240722::Status::~Status(&local_38);
  if (!bVar1) {
    ppEVar3 = absl::lts_20240722::
              StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*>::operator*
                        ((StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)
                         &_status);
    this_00 = ResolverPool::Enum::proto(*ppEVar3);
    this_01 = Enum::enumvalue(this_00);
    __end3 = RepeatedPtrField<google::protobuf::EnumValue>::begin(this_01);
    ev = (EnumValue *)RepeatedPtrField<google::protobuf::EnumValue>::end(this_01);
    while (bVar1 = internal::operator!=(&__end3,(iterator *)&ev), bVar1) {
      local_68 = internal::RepeatedPtrIterator<const_google::protobuf::EnumValue>::operator*
                           (&__end3);
      iVar2 = EnumValue::number(local_68);
      if (iVar2 == e.super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>
                   .field_1._4_4_) {
        u = EnumValue::name_abi_cxx11_(local_68);
        absl::lts_20240722::
        StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        StatusOr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                  (__return_storage_ptr__,u);
        goto LAB_004f997a;
      }
      internal::RepeatedPtrIterator<const_google::protobuf::EnumValue>::operator++(&__end3);
    }
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::FormatSpecTemplate
              (&local_b0,"unknown enum number: \'%d\'");
    absl::lts_20240722::StrFormat<int>
              (&local_a0,&local_b0,
               (int *)((long)&e.
                              super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>
                              .field_1 + 4));
    local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
    absl::lts_20240722::InvalidArgumentError(&local_70,local_80._0_8_,local_80._8_8_);
    absl::lts_20240722::
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr<absl::lts_20240722::Status,_0>(__return_storage_ptr__,&local_70);
    absl::lts_20240722::Status::~Status(&local_70);
    std::__cxx11::string::~string((string *)&local_a0);
  }
LAB_004f997a:
  absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*>::
  ~StatusOr((StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)&_status);
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<std::string> EnumNameByNumber(Field f, int32_t number) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (ev.number() == number) {
        return ev.name();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum number: '%d'", number));
  }